

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O2

arth * gen_neg(compiler_state_t *cstate,arth *a)

{
  slist *psVar1;
  
  psVar1 = xfer_to_a(cstate,a);
  sappend(psVar1,psVar1);
  psVar1 = new_stmt(cstate,0x84);
  (psVar1->s).k = 0;
  sappend(psVar1,psVar1);
  psVar1 = new_stmt(cstate,2);
  (psVar1->s).k = a->regno;
  sappend(psVar1,psVar1);
  return a;
}

Assistant:

struct arth *
gen_neg(compiler_state_t *cstate, struct arth *a)
{
	struct slist *s;

	s = xfer_to_a(cstate, a);
	sappend(a->s, s);
	s = new_stmt(cstate, BPF_ALU|BPF_NEG);
	s->s.k = 0;
	sappend(a->s, s);
	s = new_stmt(cstate, BPF_ST);
	s->s.k = a->regno;
	sappend(a->s, s);

	return a;
}